

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_well_known_types.pb.cc
# Opt level: O2

void __thiscall
proto2_unittest::OneofWellKnownTypes::set_allocated_field_mask_field
          (OneofWellKnownTypes *this,FieldMask *field_mask_field)

{
  Arena *submessage_arena;
  Arena *message_arena;
  
  message_arena = (Arena *)(this->super_Message).super_MessageLite._internal_metadata_.ptr_;
  if (((ulong)message_arena & 1) != 0) {
    message_arena = *(Arena **)((ulong)message_arena & 0xfffffffffffffffe);
  }
  clear_oneof_field(this);
  if (field_mask_field != (FieldMask *)0x0) {
    submessage_arena =
         (Arena *)(field_mask_field->super_Message).super_MessageLite._internal_metadata_.ptr_;
    if (((ulong)submessage_arena & 1) != 0) {
      submessage_arena = *(Arena **)((ulong)submessage_arena & 0xfffffffffffffffe);
    }
    if (message_arena != submessage_arena) {
      field_mask_field =
           (FieldMask *)
           google::protobuf::internal::GetOwnedMessageInternal
                     (message_arena,(MessageLite *)field_mask_field,submessage_arena);
    }
    (this->field_0)._impl_._oneof_case_[0] = 5;
    (this->field_0)._impl_.oneof_field_.any_field_ = &field_mask_field->super_Message;
  }
  return;
}

Assistant:

void OneofWellKnownTypes::set_allocated_field_mask_field(::google::protobuf::FieldMask* PROTOBUF_NULLABLE field_mask_field) {
  ::google::protobuf::Arena* message_arena = GetArena();
  clear_oneof_field();
  if (field_mask_field) {
    ::google::protobuf::Arena* submessage_arena = reinterpret_cast<::google::protobuf::Message*>(field_mask_field)->GetArena();
    if (message_arena != submessage_arena) {
      field_mask_field = ::google::protobuf::internal::GetOwnedMessage(message_arena, field_mask_field, submessage_arena);
    }
    set_has_field_mask_field();
    _impl_.oneof_field_.field_mask_field_ = field_mask_field;
  }
  // @@protoc_insertion_point(field_set_allocated:proto2_unittest.OneofWellKnownTypes.field_mask_field)
}